

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall glu::sl::ShaderParser::parseGLSLVersion(ShaderParser *this,GLSLVersion *version)

{
  bool bVar1;
  char *str;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string postfix;
  int versionNum;
  GLSLVersion *version_local;
  ShaderParser *this_local;
  
  postfix.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  assumeToken(this,TOKEN_INT_LITERAL);
  str = (char *)std::__cxx11::string::c_str();
  postfix.field_2._12_4_ = parseIntLiteral(this,str);
  advanceToken(this);
  if (this->m_curToken == TOKEN_IDENTIFIER) {
    std::__cxx11::string::operator=((string *)local_40,(string *)&this->m_curTokenStr);
    advanceToken(this);
  }
  if ((postfix.field_2._12_4_ == 100) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"es"), bVar1)) {
    *version = GLSL_VERSION_100_ES;
  }
  else if ((postfix.field_2._12_4_ == 300) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"es"), bVar1)) {
    *version = GLSL_VERSION_300_ES;
  }
  else if ((postfix.field_2._12_4_ == 0x136) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"es"), bVar1)) {
    *version = GLSL_VERSION_310_ES;
  }
  else if ((postfix.field_2._12_4_ == 0x140) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"es"), bVar1)) {
    *version = GLSL_VERSION_320_ES;
  }
  else if (postfix.field_2._12_4_ == 0x82) {
    *version = GLSL_VERSION_130;
  }
  else if (postfix.field_2._12_4_ == 0x8c) {
    *version = GLSL_VERSION_140;
  }
  else if (postfix.field_2._12_4_ == 0x96) {
    *version = GLSL_VERSION_150;
  }
  else if (postfix.field_2._12_4_ == 0x14a) {
    *version = GLSL_VERSION_330;
  }
  else if (postfix.field_2._12_4_ == 400) {
    *version = GLSL_VERSION_400;
  }
  else if (postfix.field_2._12_4_ == 0x19a) {
    *version = GLSL_VERSION_410;
  }
  else if (postfix.field_2._12_4_ == 0x1a4) {
    *version = GLSL_VERSION_420;
  }
  else if (postfix.field_2._12_4_ == 0x1ae) {
    *version = GLSL_VERSION_430;
  }
  else if (postfix.field_2._12_4_ == 0x1b8) {
    *version = GLSL_VERSION_440;
  }
  else if (postfix.field_2._12_4_ == 0x1c2) {
    *version = GLSL_VERSION_450;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Unknown GLSL version",&local_79);
    parseError(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ShaderParser::parseGLSLVersion (glu::GLSLVersion& version)
{
	int			versionNum		= 0;
	std::string	postfix			= "";

	assumeToken(TOKEN_INT_LITERAL);
	versionNum = parseIntLiteral(m_curTokenStr.c_str());
	advanceToken();

	if (m_curToken == TOKEN_IDENTIFIER)
	{
		postfix = m_curTokenStr;
		advanceToken();
	}

	DE_STATIC_ASSERT(glu::GLSL_VERSION_LAST == 14);

	if		(versionNum == 100 && postfix == "es")	version = glu::GLSL_VERSION_100_ES;
	else if (versionNum == 300 && postfix == "es")	version = glu::GLSL_VERSION_300_ES;
	else if (versionNum == 310 && postfix == "es")	version = glu::GLSL_VERSION_310_ES;
	else if (versionNum == 320 && postfix == "es")	version = glu::GLSL_VERSION_320_ES;
	else if (versionNum == 130)						version = glu::GLSL_VERSION_130;
	else if (versionNum == 140)						version = glu::GLSL_VERSION_140;
	else if (versionNum == 150)						version = glu::GLSL_VERSION_150;
	else if (versionNum == 330)						version = glu::GLSL_VERSION_330;
	else if (versionNum == 400)						version = glu::GLSL_VERSION_400;
	else if (versionNum == 410)						version = glu::GLSL_VERSION_410;
	else if (versionNum == 420)						version = glu::GLSL_VERSION_420;
	else if (versionNum == 430)						version = glu::GLSL_VERSION_430;
	else if (versionNum == 440)						version = glu::GLSL_VERSION_440;
	else if (versionNum == 450)						version = glu::GLSL_VERSION_450;
	else
		parseError("Unknown GLSL version");
}